

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::_store_scalar(Parser *this,csubstr s,flag_t is_quoted)

{
  code *pcVar1;
  bool bVar2;
  State *pSVar3;
  uint uVar4;
  
  pSVar3 = this->m_state;
  uVar4 = pSVar3->flags;
  if ((uVar4 >> 9 & 1) != 0) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    to_csubstr(
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              );
    (*(code *)PTR_error_impl_00246018)
              ("check failed: has_none(SSCL)",0x1c,(anonymous_namespace)::s_default_callbacks);
    pSVar3 = this->m_state;
    uVar4 = pSVar3->flags;
  }
  pSVar3->flags = is_quoted << 10 | uVar4 | 0x200;
  (pSVar3->scalar).str = s.str;
  (pSVar3->scalar).len = s.len;
  return;
}

Assistant:

void Parser::_store_scalar(csubstr s, flag_t is_quoted)
{
    _c4dbgpf("state[{}]: storing scalar '{}' (flag: {}) (old scalar='{}')",
             m_state-m_stack.begin(), s, m_state->flags & SSCL, m_state->scalar);
    RYML_CHECK(has_none(SSCL));
    add_flags(SSCL | (is_quoted * QSCL));
    m_state->scalar = s;
}